

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ImGuiContext *pIVar5;
  size_t __n;
  char *__dest;
  int iVar6;
  ImGuiContext *ctx;
  int iVar7;
  
  pIVar5 = GImGui;
  pcVar3 = (GImGui->ClipboardHandlerData).Data;
  if (pcVar3 != (char *)0x0) {
    (pIVar5->ClipboardHandlerData).Size = 0;
    (pIVar5->ClipboardHandlerData).Capacity = 0;
    if (pIVar5 != (ImGuiContext *)0x0) {
      piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
    (pIVar5->ClipboardHandlerData).Data = (char *)0x0;
  }
  __n = strlen(text);
  uVar4 = (uint)__n;
  iVar6 = uVar4 + 1;
  iVar2 = (pIVar5->ClipboardHandlerData).Capacity;
  if (iVar2 <= (int)uVar4) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar7,GImAllocatorUserData);
      pcVar3 = (pIVar5->ClipboardHandlerData).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(__dest,pcVar3,(long)(pIVar5->ClipboardHandlerData).Size);
        pcVar3 = (pIVar5->ClipboardHandlerData).Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (pIVar5->ClipboardHandlerData).Data = __dest;
      (pIVar5->ClipboardHandlerData).Capacity = iVar7;
    }
  }
  (pIVar5->ClipboardHandlerData).Size = iVar6;
  if (-1 < (int)uVar4) {
    memcpy((pIVar5->ClipboardHandlerData).Data,text,__n);
    if ((int)uVar4 < (pIVar5->ClipboardHandlerData).Size) {
      (pIVar5->ClipboardHandlerData).Data[uVar4 & 0x7fffffff] = '\0';
      return;
    }
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                ,0x658,"T &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.ClipboardHandlerData.clear();
    const char* text_end = text + strlen(text);
    g.ClipboardHandlerData.resize((int)(text_end - text) + 1);
    memcpy(&g.ClipboardHandlerData[0], text, (size_t)(text_end - text));
    g.ClipboardHandlerData[(int)(text_end - text)] = 0;
}